

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

void __thiscall xmrig::Buffer::move(Buffer *this,Buffer *other)

{
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  
  if ((in_RDI[1] != 0) && ((void *)*in_RDI != (void *)0x0)) {
    operator_delete__((void *)*in_RDI);
  }
  *in_RDI = *in_RSI;
  in_RDI[1] = in_RSI[1];
  *in_RSI = 0;
  in_RSI[1] = 0;
  return;
}

Assistant:

void xmrig::Buffer::move(Buffer &&other)
{
    if (m_size > 0) {
        delete [] m_data;
    }

    m_data = other.m_data;
    m_size = other.m_size;

    other.m_data = nullptr;
    other.m_size = 0;
}